

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  int iVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  wchar_t wVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  wchar_t *pwVar13;
  size_t sVar14;
  uint uVar15;
  wchar_t wVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  wchar_t local_68 [12];
  char_type buffer [13];
  
  pwVar3 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar8 = it->blackhole_;
  uVar4 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  lVar18 = (long)iVar1;
  pwVar13 = local_68 + lVar18;
  if (uVar4 < 100) {
    bVar20 = false;
  }
  else {
    iVar5 = -1;
    uVar9 = 1;
    iVar17 = -2;
    uVar19 = 2;
    do {
      uVar15 = uVar4;
      uVar12 = (ulong)((uVar15 % 100) * 2);
      pwVar13[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar12 + 1];
      lVar10 = -4;
      if ((int)(uVar9 / 3) * 3 + iVar5 == 0) {
        pwVar13[-2] = *(wchar_t *)(this + 8);
        lVar10 = -8;
      }
      *(int *)((long)pwVar13 + lVar10 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar12];
      if ((int)(uVar19 / 3) * 3 + iVar17 == 0) {
        *(undefined4 *)((long)pwVar13 + lVar10 + -8) = *(undefined4 *)(this + 8);
        lVar10 = lVar10 + -8;
      }
      else {
        lVar10 = lVar10 + -4;
      }
      pwVar13 = (wchar_t *)((long)pwVar13 + lVar10);
      iVar5 = iVar5 + -2;
      uVar7 = (int)uVar9 + 2;
      uVar9 = (ulong)uVar7;
      iVar17 = iVar17 + -2;
      uVar19 = (ulong)((int)uVar19 + 2);
      uVar4 = uVar15 / 100;
    } while (9999 < uVar15);
    bVar20 = iVar5 + (uVar7 / 3) * 3 == 0;
    uVar4 = uVar15 / 100;
  }
  if (uVar4 < 10) {
    wVar16 = uVar4 | 0x30;
  }
  else {
    pwVar13[-1] = (int)(char)internal::basic_data<void>::DIGITS[((ulong)uVar4 * 2 & 0xffffffff) + 1]
    ;
    lVar10 = -4;
    if (bVar20) {
      pwVar13[-2] = *(wchar_t *)(this + 8);
      lVar10 = -8;
    }
    pwVar13 = (wchar_t *)((long)pwVar13 + lVar10);
    wVar16 = (wchar_t)(char)internal::basic_data<void>::DIGITS[(ulong)uVar4 * 2];
  }
  pwVar13[-1] = wVar16;
  if (0 < iVar1) {
    lVar10 = lVar18 + 1;
    pwVar13 = local_68;
    sVar14 = sVar6;
    do {
      if (sVar14 < uVar2) {
        *pwVar3 = *pwVar13;
        lVar11 = 4;
      }
      else {
        lVar11 = 0;
        wVar8 = *pwVar13;
      }
      pwVar13 = pwVar13 + 1;
      sVar14 = sVar14 + 1;
      pwVar3 = (wchar_t *)((long)pwVar3 + lVar11);
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
    sVar6 = sVar6 + lVar18;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar3;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar6;
  it->blackhole_ = wVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }